

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapping.cpp
# Opt level: O2

void matrixFromStdVector(void)

{
  ostream *poVar1;
  initializer_list<float> __l;
  vector<float,_std::allocator<float>_> data;
  Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> einMatRowMajor;
  Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> einMatColMajor;
  
  einMatColMajor._0_8_ = 0x400000003f800000;
  einMatColMajor._8_2_ = 0;
  einMatColMajor.m_stride = (Stride<0,_0>)0x4040;
  einMatColMajor._12_4_ = 0x40800000;
  __l._M_len = 9;
  __l._M_array = (iterator)&einMatColMajor;
  std::vector<float,_std::allocator<float>_>::vector(&data,__l,(allocator_type *)&einMatRowMajor);
  einMatColMajor._0_8_ =
       data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                              *)&einMatColMajor);
  std::endl<char,std::char_traits<char>>(poVar1);
  einMatRowMajor._0_8_ =
       data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                              *)&einMatRowMajor);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&data.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void matrixFromStdVector() {
  std::vector<float> data = {1, 2, 3, 4, 5, 6, 7, 8, 9};

  auto einMatColMajor = Eigen::Map<Eigen::Matrix<float, 3, 3>>(data.data());

  data.clear();
  std::cout << einMatColMajor << std::endl;

  auto einMatRowMajor =
      Eigen::Map<Eigen::Matrix<float, 3, 3, Eigen::RowMajor>>(data.data());

  std::cout << einMatRowMajor << std::endl;
}